

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall QPDFObjectHandle::getBoolValue(QPDFObjectHandle *this)

{
  undefined1 uVar1;
  QPDF_Bool *pQVar2;
  allocator<char> local_31;
  string local_30;
  
  pQVar2 = ::qpdf::BaseHandle::as<QPDF_Bool>(&this->super_BaseHandle);
  if (pQVar2 == (QPDF_Bool *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"returning false",&local_31);
    typeWarning(this,"boolean",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    uVar1 = 0;
  }
  else {
    uVar1 = pQVar2->val;
  }
  return (bool)uVar1;
}

Assistant:

bool
QPDFObjectHandle::getBoolValue() const
{
    if (auto boolean = as<QPDF_Bool>()) {
        return boolean->val;
    } else {
        typeWarning("boolean", "returning false");
        QTC::TC("qpdf", "QPDFObjectHandle boolean returning false");
        return false;
    }
}